

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O2

Abc_Obj_t * Abc_NtkCreateNodeInv(Abc_Ntk_t *pNtk,Abc_Obj_t *pFanin)

{
  Abc_Obj_t *pObj;
  Hop_Obj_t *pHVar1;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar2;
  DdNode *pDVar3;
  
  if (pNtk->ntkType - ABC_NTK_NETLIST < 2) {
    pObj = Abc_NtkCreateNode(pNtk);
    if (pFanin != (Abc_Obj_t *)0x0) {
      Abc_ObjAddFanin(pObj,pFanin);
    }
    switch(pNtk->ntkFunc) {
    case ABC_FUNC_SOP:
      pMVar2 = (Mio_Gate_t *)Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,"0 1\n");
      break;
    case ABC_FUNC_BDD:
      pDVar3 = Cudd_bddIthVar((DdManager *)pNtk->pManFunc,0);
      (pObj->field_5).pData = (DdNode *)((ulong)pDVar3 ^ 1);
      Cudd_Ref((DdNode *)((ulong)pDVar3 ^ 1));
      return pObj;
    case ABC_FUNC_AIG:
      pHVar1 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,0);
      pMVar2 = (Mio_Gate_t *)((ulong)pHVar1 ^ 1);
      break;
    case ABC_FUNC_MAP:
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      pMVar2 = Mio_LibraryReadInv(pLib);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                    ,0x2b2,"Abc_Obj_t *Abc_NtkCreateNodeInv(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    (pObj->field_5).pData = pMVar2;
    return pObj;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                ,0x2a4,"Abc_Obj_t *Abc_NtkCreateNodeInv(Abc_Ntk_t *, Abc_Obj_t *)");
}

Assistant:

Abc_Obj_t * Abc_NtkCreateNodeInv( Abc_Ntk_t * pNtk, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pNode;
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk) );
    pNode = Abc_NtkCreateNode( pNtk );   
    if ( pFanin ) Abc_ObjAddFanin( pNode, pFanin );
    if ( Abc_NtkHasSop(pNtk) )
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, "0 1\n" );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        pNode->pData = Cudd_Not(Cudd_bddIthVar((DdManager *)pNtk->pManFunc,0)), Cudd_Ref( (DdNode *)pNode->pData );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        pNode->pData = Hop_Not(Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,0));
    else if ( Abc_NtkHasMapping(pNtk) )
        pNode->pData = Mio_LibraryReadInv((Mio_Library_t *)Abc_FrameReadLibGen());
    else
        assert( 0 );
    return pNode;
}